

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

ItaniumPartialDemangler * __thiscall
llvm::ItaniumPartialDemangler::operator=
          (ItaniumPartialDemangler *this,ItaniumPartialDemangler *Other)

{
  void *pvVar1;
  
  pvVar1 = this->RootNode;
  this->RootNode = Other->RootNode;
  Other->RootNode = pvVar1;
  pvVar1 = this->Context;
  this->Context = Other->Context;
  Other->Context = pvVar1;
  return this;
}

Assistant:

ItaniumPartialDemangler &ItaniumPartialDemangler::
operator=(ItaniumPartialDemangler &&Other) {
  std::swap(RootNode, Other.RootNode);
  std::swap(Context, Other.Context);
  return *this;
}